

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cc
# Opt level: O2

fdb_status fdb_end_transaction(fdb_file_handle *fhandle,fdb_commit_opt_t opt)

{
  fdb_kvs_handle *handle;
  filemgr *file;
  fdb_status fVar1;
  
  fVar1 = FDB_RESULT_INVALID_HANDLE;
  if ((fhandle != (fdb_file_handle *)0x0) &&
     (handle = fhandle->root, handle != (fdb_kvs_handle *)0x0)) {
    if (handle->txn == (fdb_txn *)0x0) {
      fVar1 = FDB_RESULT_TRANSACTION_FAIL;
    }
    else if (((handle->kvs == (kvs_info *)0x0) || (handle->kvs->type != '\x01')) &&
            ((handle->txn->items->head == (list_elem *)0x0 ||
             (fVar1 = _fdb_commit(handle,opt,((handle->config).durability_opt & 2) == 0),
             fVar1 == FDB_RESULT_SUCCESS)))) {
      while( true ) {
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        file = handle->file;
        filemgr_mutex_lock(file);
        fdb_sync_db_header(handle);
        if ((file->status).super___atomic_base<unsigned_char>._M_i != '\x04') break;
        filemgr_mutex_unlock(file);
      }
      wal_remove_transaction(file,handle->txn);
      free(handle->txn->items);
      free(handle->txn->wrapper);
      free(handle->txn);
      handle->txn = (fdb_txn *)0x0;
      filemgr_mutex_unlock(file);
      fVar1 = FDB_RESULT_SUCCESS;
    }
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_end_transaction(fdb_file_handle *fhandle,
                               fdb_commit_opt_t opt)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    file_status_t fstatus;
    fdb_kvs_handle *handle = fhandle->root;
    struct filemgr *file;

    if (handle->txn == NULL) {
        // there is no transaction started
        return FDB_RESULT_TRANSACTION_FAIL;
    }
    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny transaction on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }

    fdb_status fs = FDB_RESULT_SUCCESS;
    if (list_begin(handle->txn->items)) {
        fs = _fdb_commit(handle, opt,
                       !(handle->config.durability_opt & FDB_DRB_ASYNC));
    }

    if (fs == FDB_RESULT_SUCCESS) {

        do { // repeat until file status is not REMOVED_PENDING
            fdb_check_file_reopen(handle, NULL);

            file = handle->file;
            filemgr_mutex_lock(file);
            fdb_sync_db_header(handle);

            fstatus = filemgr_get_file_status(file);
            if (fstatus == FILE_REMOVED_PENDING) {
                // we must not commit transaction on this file
                // file status was changed by other thread .. start over
                filemgr_mutex_unlock(file);
            }
        } while (fstatus == FILE_REMOVED_PENDING);

        wal_remove_transaction(file, handle->txn);

        free(handle->txn->items);
        free(handle->txn->wrapper);
        free(handle->txn);
        handle->txn = NULL;

        filemgr_mutex_unlock(file);
    }

    return fs;
}